

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O0

err_t cmdCVCsVal(octet *certs,size_t certs_len,octet *date)

{
  bool_t bVar1;
  btok_cvc_t *dest;
  size_t sVar2;
  btok_cvc_t *cvc_00;
  btok_cvc_t *date_00;
  octet *in_RDX;
  long in_RSI;
  btok_cvc_t *cvc;
  btok_cvc_t *cvca;
  size_t len;
  void *stack;
  err_t code;
  octet *in_stack_00000040;
  btok_cvc_t *in_stack_00000048;
  size_t in_stack_ffffffffffffffb8;
  btok_cvc_t *der;
  btok_cvc_t *cvca_00;
  undefined4 in_stack_ffffffffffffffd8;
  err_t local_4;
  
  if (in_RSI == 0) {
    local_4 = 0;
  }
  else {
    dest = (btok_cvc_t *)blobCreate(in_stack_ffffffffffffffb8);
    local_4 = 0x6e;
    if (dest != (btok_cvc_t *)0x0) {
      local_4 = 0;
    }
    if (local_4 == 0) {
      der = dest + 1;
      cvca_00 = dest;
      sVar2 = btokCVCLen((octet *)der,0x104aa8);
      if (sVar2 == 0xffffffffffffffff) {
        local_4 = 0x202;
      }
      if (local_4 == 0) {
        local_4 = btokCVCUnwrap(in_stack_00000048,in_stack_00000040,(size_t)certs,(octet *)certs_len
                                ,(size_t)date);
        if (local_4 == 0) {
          cvc_00 = (btok_cvc_t *)(in_RSI - sVar2);
          while (cvc_00 != (btok_cvc_t *)0x0) {
            date_00 = (btok_cvc_t *)btokCVCLen((octet *)der,0x104b55);
            if (date_00 == (btok_cvc_t *)0xffffffffffffffff) {
              local_4 = 0x202;
            }
            if (local_4 != 0) {
              blobClose((blob_t)0x104b7b);
              return local_4;
            }
            if (((date_00 == cvc_00) && (in_RDX != (octet *)0x0)) &&
               (bVar1 = memIsZero(in_RDX,6), bVar1 == 0)) {
              local_4 = btokCVCVal2(cvc_00,in_RDX,CONCAT44(local_4,in_stack_ffffffffffffffd8),
                                    cvca_00,(octet *)date_00);
            }
            else {
              local_4 = btokCVCVal2(cvc_00,in_RDX,CONCAT44(local_4,in_stack_ffffffffffffffd8),
                                    cvca_00,(octet *)date_00);
            }
            if (local_4 != 0) {
              blobClose((blob_t)0x104c05);
              return local_4;
            }
            cvc_00 = (btok_cvc_t *)((long)cvc_00 - (long)date_00);
            memCopy(dest,der,0x104c43);
          }
          blobClose((blob_t)0x104c52);
        }
        else {
          blobClose((blob_t)0x104b0c);
        }
      }
      else {
        blobClose((blob_t)0x104ace);
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdCVCsVal(const octet* certs, size_t certs_len, const octet date[6])
{
	err_t code;
	void* stack;
	size_t len;
	btok_cvc_t* cvca;
	btok_cvc_t* cvc;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsNullOrValid(date, 6));
	// пустая цепочка?
	if (!certs_len)
		return ERR_OK;
	// выделить и разметить память
	code = cmdBlobCreate(stack, 2 * sizeof(btok_cvc_t));
	ERR_CALL_CHECK(code);
	cvca = (btok_cvc_t*)stack;
	cvc = cvca + 1;
	// найти и разобрать первый сертификат
	len = btokCVCLen(certs, certs_len);
	if (len == SIZE_MAX)
		code = ERR_BAD_CERT;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	code = btokCVCUnwrap(cvca, certs, len, 0, 0);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	certs_len -= len, certs += len;
	// цикл по остальным сертификатам
	while (certs_len)
	{
		// разобрать сертификат
		len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			code = ERR_BAD_CERT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить сертификат
		if (len == certs_len && date && !memIsZero(date, 6))
			code = btokCVCVal2(cvc, certs, len, cvca, date);
		else
			code = btokCVCVal2(cvc, certs, len, cvca, 0);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// к следующему сертификату
		certs_len -= len, certs += len;
		// издатель <- эмитент
		memCopy(cvca, cvc, sizeof(btok_cvc_t));
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}